

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

int __thiscall mpt::layout::line::convert(line *this,type_t type,void *ptr)

{
  bool bVar1;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  lineattr *plStack_88;
  int col;
  color *pcStack_78;
  int la;
  line local_6c;
  object *poStack_50;
  int li_1;
  line *plStack_40;
  int li;
  line *local_38;
  int local_2c;
  undefined8 *puStack_28;
  int me;
  void *ptr_local;
  type_t type_local;
  line *this_local;
  
  puStack_28 = (undefined8 *)ptr;
  ptr_local = (void *)type;
  type_local = (type_t)this;
  local_2c = type_properties<mpt::layout::line_*>::id(true);
  if (local_2c < 0) {
    local_2c = 0x100;
  }
  else {
    local_38 = this;
    bVar1 = assign<mpt::layout::line*>(&local_38,(int)ptr_local,puStack_28);
    if (bVar1) {
      return local_2c;
    }
  }
  if (ptr_local == (void *)0x0) {
    if (puStack_28 != (undefined8 *)0x0) {
      *puStack_28 = convert::fmt;
    }
    this_local._4_4_ = local_2c;
  }
  else {
    plStack_40 = this;
    bVar1 = assign<mpt::metatype*>((metatype **)&stack0xffffffffffffffc0,(int)ptr_local,puStack_28);
    if (bVar1) {
      local_9c = type_properties<mpt::line>::id(true);
      if (local_9c < 1) {
        local_9c = local_2c;
      }
      this_local._4_4_ = local_9c;
    }
    else {
      poStack_50 = &this->super_object;
      bVar1 = assign<mpt::object*>(&stack0xffffffffffffffb0,(int)ptr_local,puStack_28);
      if (bVar1) {
        local_a0 = type_properties<mpt::line>::id(true);
        if (local_a0 < 1) {
          local_a0 = local_2c;
        }
        this_local._4_4_ = local_a0;
      }
      else {
        mpt::line::line(&local_6c,&this->super_line);
        bVar1 = assign<mpt::line>(&local_6c,(int)ptr_local,puStack_28);
        if (bVar1) {
          this_local._4_4_ = 0x84;
        }
        else {
          pcStack_78 = &(this->super_line).color;
          bVar1 = assign<mpt::color*>(&stack0xffffffffffffff88,(int)ptr_local,puStack_28);
          if (bVar1) {
            local_a4 = type_properties<mpt::lineattr>::id(true);
            if (local_a4 < 1) {
              local_a4 = local_2c;
            }
            this_local._4_4_ = local_a4;
          }
          else {
            plStack_88 = &(this->super_line).attr;
            bVar1 = assign<mpt::lineattr*>(&stack0xffffffffffffff78,(int)ptr_local,puStack_28);
            if (bVar1) {
              local_a8 = type_properties<mpt::color>::id(true);
              if (local_a8 < 1) {
                local_a8 = local_2c;
              }
              this_local._4_4_ = local_a8;
            }
            else {
              this_local._4_4_ = -3;
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int layout::line::convert(type_t type, void *ptr)
{
	int me = type_properties<line *>::id(true);
	if (me < 0) {
		me = TypeMetaPtr;
	}
	else if (assign(this, type, ptr)) {
		return me;
	}
	
	if (!type) {
		static const uint8_t fmt[] = {
			TypeObjectPtr,
			0
		};
		if (ptr) *static_cast<const uint8_t **>(ptr) = fmt;
		return me;
	}
	
	if (assign(static_cast<metatype *>(this), type, ptr)) {
		int li = type_properties<::mpt::line>::id(true);
		return li > 0 ? li : me;
	}
	if (assign(static_cast<object *>(this), type, ptr)) {
		int li = type_properties<::mpt::line>::id(true);
		return li > 0 ? li : me;
	}
	if (assign(static_cast< ::mpt::line>(*this), type, ptr)) {
		return TypeObjectPtr;
	}
	if (assign(&color, type, ptr)) {
		int la = type_properties<::mpt::lineattr>::id(true);
		return la > 0 ? la : me;
	}
	if (assign(&attr, type, ptr)) {
		int col = type_properties<::mpt::color>::id(true);
		return col > 0 ? col : me;
	}
	return BadType;
}